

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int moveToRoot(BtCursor *pCur)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  MemPage *pMVar4;
  undefined8 uVar5;
  
  if (pCur->iPage < '\0') {
    if (pCur->pgnoRoot != 0) {
      if (2 < pCur->eState) {
        if (pCur->eState == 4) {
          return pCur->skipNext;
        }
        sqlite3_free(pCur->pKey);
        pCur->pKey = (void *)0x0;
        pCur->eState = '\x01';
      }
      iVar3 = getAndInitPage(pCur->pBtree->pBt,pCur->pgnoRoot,&pCur->pPage,(BtCursor *)0x0,
                             (uint)pCur->curPagerFlags);
      if (iVar3 != 0) {
        pCur->eState = '\x01';
        return iVar3;
      }
      pCur->iPage = '\0';
      pCur->curIntKey = pCur->pPage->intKey;
      goto LAB_0014a467;
    }
LAB_0014a3e3:
    pCur->eState = '\x01';
    iVar3 = 0x10;
  }
  else {
    if (pCur->iPage == '\0') {
LAB_0014a467:
      if ((pCur->pPage->isInit != '\0') &&
         ((bool)pCur->pPage->intKey == (pCur->pKeyInfo == (KeyInfo *)0x0))) goto LAB_0014a3a2;
      uVar5 = 0x109c3;
    }
    else {
      pMVar4 = pCur->pPage;
      while( true ) {
        sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
        cVar2 = pCur->iPage + -1;
        pCur->iPage = cVar2;
        if (cVar2 == '\0') break;
        pMVar4 = pCur->apPage[cVar2];
      }
      pCur->pPage = pCur->apPage[0];
LAB_0014a3a2:
      pCur->ix = 0;
      (pCur->info).nSize = 0;
      pCur->curFlags = pCur->curFlags & 0xf1;
      pMVar4 = pCur->pPage;
      if (pMVar4->nCell != 0) {
        pCur->eState = '\0';
        return 0;
      }
      if (pMVar4->leaf != '\0') goto LAB_0014a3e3;
      if (pMVar4->pgno == 1) {
        uVar1 = *(uint *)(pMVar4->aData + (ulong)pMVar4->hdrOffset + 8);
        pCur->eState = '\0';
        iVar3 = moveToChild(pCur,uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                                 uVar1 << 0x18);
        return iVar3;
      }
      uVar5 = 0x109d0;
    }
    iVar3 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar5,
                "bf8c1b2b7a5960c282e543b9c293686dccff272512d08865f4600fb58238b4f9");
  }
  return iVar3;
}

Assistant:

static int moveToRoot(BtCursor *pCur){
  MemPage *pRoot;
  int rc = SQLITE_OK;

  assert( cursorOwnsBtShared(pCur) );
  assert( CURSOR_INVALID < CURSOR_REQUIRESEEK );
  assert( CURSOR_VALID   < CURSOR_REQUIRESEEK );
  assert( CURSOR_FAULT   > CURSOR_REQUIRESEEK );
  assert( pCur->eState < CURSOR_REQUIRESEEK || pCur->iPage<0 );
  assert( pCur->pgnoRoot>0 || pCur->iPage<0 );

  if( pCur->iPage>=0 ){
    if( pCur->iPage ){
      releasePageNotNull(pCur->pPage);
      while( --pCur->iPage ){
        releasePageNotNull(pCur->apPage[pCur->iPage]);
      }
      pCur->pPage = pCur->apPage[0];
      goto skip_init;
    }
  }else if( pCur->pgnoRoot==0 ){
    pCur->eState = CURSOR_INVALID;
    return SQLITE_EMPTY;
  }else{
    assert( pCur->iPage==(-1) );
    if( pCur->eState>=CURSOR_REQUIRESEEK ){
      if( pCur->eState==CURSOR_FAULT ){
        assert( pCur->skipNext!=SQLITE_OK );
        return pCur->skipNext;
      }
      sqlite3BtreeClearCursor(pCur);
    }
    rc = getAndInitPage(pCur->pBtree->pBt, pCur->pgnoRoot, &pCur->pPage,
                        0, pCur->curPagerFlags);
    if( rc!=SQLITE_OK ){
      pCur->eState = CURSOR_INVALID;
      return rc;
    }
    pCur->iPage = 0;
    pCur->curIntKey = pCur->pPage->intKey;
  }
  pRoot = pCur->pPage;
  assert( pRoot->pgno==pCur->pgnoRoot );

  /* If pCur->pKeyInfo is not NULL, then the caller that opened this cursor
  ** expected to open it on an index b-tree. Otherwise, if pKeyInfo is
  ** NULL, the caller expects a table b-tree. If this is not the case,
  ** return an SQLITE_CORRUPT error. 
  **
  ** Earlier versions of SQLite assumed that this test could not fail
  ** if the root page was already loaded when this function was called (i.e.
  ** if pCur->iPage>=0). But this is not so if the database is corrupted 
  ** in such a way that page pRoot is linked into a second b-tree table 
  ** (or the freelist).  */
  assert( pRoot->intKey==1 || pRoot->intKey==0 );
  if( pRoot->isInit==0 || (pCur->pKeyInfo==0)!=pRoot->intKey ){
    return SQLITE_CORRUPT_PAGE(pCur->pPage);
  }

skip_init:  
  pCur->ix = 0;
  pCur->info.nSize = 0;
  pCur->curFlags &= ~(BTCF_AtLast|BTCF_ValidNKey|BTCF_ValidOvfl);

  pRoot = pCur->pPage;
  if( pRoot->nCell>0 ){
    pCur->eState = CURSOR_VALID;
  }else if( !pRoot->leaf ){
    Pgno subpage;
    if( pRoot->pgno!=1 ) return SQLITE_CORRUPT_BKPT;
    subpage = get4byte(&pRoot->aData[pRoot->hdrOffset+8]);
    pCur->eState = CURSOR_VALID;
    rc = moveToChild(pCur, subpage);
  }else{
    pCur->eState = CURSOR_INVALID;
    rc = SQLITE_EMPTY;
  }
  return rc;
}